

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_st_8_al(void)

{
  uint address;
  
  address = m68ki_read_imm_32();
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,0xff);
  return;
}

Assistant:

static void m68k_op_st_8_al(void)
{
	m68ki_write_8(EA_AL_8(), 0xff);
}